

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void insert(upb_table *t,lookupkey_t key,upb_key tabkey,upb_value val,uint32_t hash,
           hashfunc_t *hashfunc,eqlfunc_t *eql)

{
  upb_key uVar1;
  _upb_tabent *p_Var2;
  _upb_tabent *p_Var3;
  uint uVar4;
  uint32_t uVar5;
  upb_tabent *puVar6;
  upb_tabent *puVar7;
  _upb_tabent *p_Var8;
  _upb_tabent *p_Var9;
  _upb_tabent *p_Var10;
  _upb_tabent *p_Var11;
  
  puVar6 = findentry(t,key,hash,eql);
  if (puVar6 != (upb_tabent *)0x0) {
    __assert_fail("findentry(t, key, hash, eql) == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0xbb,
                  "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  t->count = t->count + 1;
  p_Var10 = t->entries;
  uVar4 = t->mask & hash;
  puVar6 = p_Var10 + uVar4;
  p_Var2 = p_Var10 + uVar4;
  if ((p_Var2->key).num != 0) {
    p_Var8 = p_Var10 + (t->mask + 1);
    p_Var9 = p_Var10 + uVar4;
    do {
      p_Var11 = p_Var9 + 1;
      if (p_Var8 <= p_Var11) goto LAB_0024f466;
      p_Var3 = p_Var9 + 1;
      p_Var9 = p_Var11;
    } while ((p_Var3->key).num != 0);
    goto LAB_0024f476;
  }
  goto LAB_0024f4cd;
LAB_0024f466:
  while( true ) {
    if (p_Var8 <= p_Var10) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x90,"upb_tabent *emptyent(upb_table *, upb_tabent *)");
    }
    p_Var11 = p_Var10;
    if ((p_Var10->key).num == 0) break;
    p_Var10 = p_Var10 + 1;
  }
LAB_0024f476:
  uVar5 = (*hashfunc)(p_Var2->key);
  uVar4 = t->mask;
  puVar7 = t->entries;
  if (puVar7 + (uVar5 & uVar4) == puVar6) {
    p_Var11->next = puVar6->next;
    puVar6->next = p_Var11;
    goto LAB_0024f4e3;
  }
  p_Var11->next = puVar6->next;
  uVar1 = puVar6->key;
  (p_Var11->val).val = (puVar6->val).val;
  p_Var11->key = uVar1;
  puVar7 = puVar7 + (uVar5 & uVar4);
  while (p_Var10 = puVar7->next, p_Var10 != puVar6) {
    puVar7 = p_Var10;
    if (p_Var10 == (_upb_tabent *)0x0) {
      __assert_fail("chain",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0xd7,
                    "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                   );
    }
  }
  puVar7->next = p_Var11;
LAB_0024f4cd:
  puVar6->next = (_upb_tabent *)0x0;
  p_Var11 = puVar6;
LAB_0024f4e3:
  p_Var11->key = tabkey;
  (p_Var11->val).val = val.val;
  puVar6 = findentry(t,key,hash,eql);
  if (puVar6 != p_Var11) {
    __assert_fail("findentry(t, key, hash, eql) == our_e",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0xe0,
                  "void insert(upb_table *, lookupkey_t, upb_key, upb_value, uint32_t, hashfunc_t *, eqlfunc_t *)"
                 );
  }
  return;
}

Assistant:

static void insert(upb_table* t, lookupkey_t key, upb_key tabkey, upb_value val,
                   uint32_t hash, hashfunc_t* hashfunc, eqlfunc_t* eql) {
  upb_tabent* mainpos_e;
  upb_tabent* our_e;

  UPB_ASSERT(findentry(t, key, hash, eql) == NULL);

  t->count++;
  mainpos_e = getentry_mutable(t, hash);
  our_e = mainpos_e;

  if (upb_tabent_isempty(mainpos_e)) {
    /* Our main position is empty; use it. */
    our_e->next = NULL;
  } else {
    /* Collision. */
    upb_tabent* new_e = emptyent(t, mainpos_e);
    /* Head of collider's chain. */
    upb_tabent* chain = getentry_mutable(t, hashfunc(mainpos_e->key));
    if (chain == mainpos_e) {
      /* Existing ent is in its main position (it has the same hash as us, and
       * is the head of our chain).  Insert to new ent and append to this chain.
       */
      new_e->next = mainpos_e->next;
      mainpos_e->next = new_e;
      our_e = new_e;
    } else {
      /* Existing ent is not in its main position (it is a node in some other
       * chain).  This implies that no existing ent in the table has our hash.
       * Evict it (updating its chain) and use its ent for head of our chain. */
      *new_e = *mainpos_e; /* copies next. */
      while (chain->next != mainpos_e) {
        chain = (upb_tabent*)chain->next;
        UPB_ASSERT(chain);
      }
      chain->next = new_e;
      our_e = mainpos_e;
      our_e->next = NULL;
    }
  }
  our_e->key = tabkey;
  our_e->val = val;
  UPB_ASSERT(findentry(t, key, hash, eql) == our_e);
}